

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int readdigits(RN *rn,int hex)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  int iVar4;
  
  iVar4 = 0;
  ppuVar3 = __ctype_b_loc();
  while( true ) {
    if (hex == 0) {
      bVar1 = *(byte *)((long)*ppuVar3 + (long)rn->c * 2 + 1) & 8;
    }
    else {
      bVar1 = *(byte *)((long)*ppuVar3 + (long)rn->c * 2 + 1) & 0x10;
    }
    if ((bVar1 == 0) || (iVar2 = nextc(rn), iVar2 == 0)) break;
    iVar4 = iVar4 + 1;
  }
  return iVar4;
}

Assistant:

static int readdigits (RN *rn, int hex) {
  int count = 0;
  while ((hex ? isxdigit(rn->c) : isdigit(rn->c)) && nextc(rn))
    count++;
  return count;
}